

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O3

void __thiscall Steiner::plot(Steiner *this,string *plotName)

{
  int iVar1;
  pointer pcVar2;
  pointer pPVar3;
  ostream *poVar4;
  pointer pEVar5;
  ulong uVar6;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  pointer pPVar11;
  long lVar12;
  long lVar13;
  pointer pPVar14;
  int iVar15;
  bool bVar16;
  string ofileName;
  ofstream of;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  pointer piVar7;
  
  local_250[0] = local_240;
  pcVar2 = (plotName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_250,pcVar2,pcVar2 + plotName->_M_string_length);
  std::ofstream::ofstream(&local_230,(string *)local_250,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set size ratio -1",0x11)
  ;
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set nokey",9);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set xrange[",0xb);
  poVar4 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryRight - this->_boundaryLeft) * -0.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryRight - this->_boundaryLeft) * 1.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set yrange[",0xb);
  poVar4 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryTop - this->_boundaryBottom) * -0.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryTop - this->_boundaryBottom) * 1.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set object ",0xb);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," rect from ",0xb);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->_boundaryLeft);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->_boundaryBottom);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->_boundaryRight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->_boundaryTop);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"fc rgb \"grey\" behind\n",0x15);
  if (0 < this->_init_p) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"set object circle at first ",0x1b);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_230,
                          *(int *)((long)&((this->_points).
                                           super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                           .super__Vector_impl_data._M_start)->x + lVar12));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,*(int *)((long)&((this->_points).
                                                  super__Vector_base<Point,_std::allocator<Point>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->y +
                                         lVar12));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," radius char 0.3 fillstyle solid ",0x21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"fc rgb \"red\" front\n",0x13);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar13 < this->_init_p);
  }
  pEVar5 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
      super__Vector_impl_data._M_finish == pEVar5) {
    iVar15 = 2;
  }
  else {
    iVar15 = 2;
    uVar6 = 0;
    do {
      iVar1 = pEVar5[uVar6].p1;
      pPVar14 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar8 = pEVar5[uVar6].p2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," from ",6);
      pPVar11 = pPVar14 + iVar1;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
      pPVar14 = pPVar14 + iVar8;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," nohead lc rgb \"white\" lw 1 front\n",0x22);
      uVar6 = (ulong)(iVar15 - 1);
      pEVar5 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pEVar5 >> 2) * -0x3333333333333333;
      iVar15 = iVar15 + 1;
    } while (uVar6 <= uVar9 && uVar9 - uVar6 != 0);
  }
  piVar7 = (this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    uVar6 = 0;
    uVar9 = 1;
    do {
      pPVar14 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar5 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = pEVar5[piVar7[uVar6]].p1;
      iVar8 = pEVar5[piVar7[uVar6]].p2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," from ",6);
      pPVar11 = pPVar14 + iVar1;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
      pPVar14 = pPVar14 + iVar8;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," nohead lc rgb \"blue\" lw 1 front\n",0x21);
      piVar7 = (this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar15 = iVar15 + 1;
      bVar16 = uVar9 < (ulong)((long)(this->_init_MST).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2)
      ;
      uVar6 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar16);
  }
  uVar10 = this->_init_p;
  uVar6 = (ulong)uVar10;
  if (uVar6 < (ulong)((long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5)) {
    do {
      uVar10 = uVar10 + 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"set object circle at first ",0x1b);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_230,
                          (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar6].y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," radius char 0.3 fillstyle solid ",0x21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"fc rgb \"yellow\" front\n",0x16);
      uVar6 = (ulong)uVar10;
    } while (uVar6 < (ulong)((long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  piVar7 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar7) {
    uVar6 = 0;
    uVar9 = 1;
    do {
      iVar1 = piVar7[uVar6];
      uVar6 = (ulong)iVar1;
      iVar8 = iVar1 + 0x3f;
      if (-1 < (long)uVar6) {
        iVar8 = iVar1;
      }
      if (((this->_edges_del).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [(long)(iVar8 >> 6) +
            (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar6 & 0x3f) & 1) == 0) {
        pPVar3 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar5 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = pEVar5[uVar6].p1;
        pPVar14 = pPVar3 + iVar1;
        iVar8 = pEVar5[uVar6].p2;
        pPVar11 = pPVar3 + iVar8;
        if (pPVar3[iVar1].x != pPVar3[iVar8].x) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," from ",6);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->y);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
          iVar15 = iVar15 + 1;
        }
        if (pPVar14->y != pPVar11->y) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," from ",6);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar14->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar11->y);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
          iVar15 = iVar15 + 1;
        }
      }
      piVar7 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar16 = uVar9 < (ulong)((long)(this->_MST).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2);
      uVar6 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar16);
  }
  if ((this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = 0;
    uVar9 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," from ",6);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p1].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p1].y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p2].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p1].y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar15 + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," from ",6);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p2].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p1].y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p2].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar6].p2].y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
      uVar6 = ((long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      iVar15 = iVar15 + 2;
      bVar16 = uVar9 <= uVar6;
      lVar12 = uVar6 - uVar9;
      uVar6 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar16 && lVar12 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"plot 1000000000",0xf);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"pause -1 \'Press any key\'",0x18);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  return;
}

Assistant:

void Steiner::plot(const string& plotName) {
  string ofileName = plotName;
  ofstream of(ofileName, ofstream::out);
  of << "set size ratio -1" << endl;
  of << "set nokey" << endl;
  of << "set xrange["
     << (_boundaryRight - _boundaryLeft) * -0.05 << ":"
     << (_boundaryRight - _boundaryLeft) * 1.05 << "]" << endl;
  of << "set yrange["
     << (_boundaryTop - _boundaryBottom) * -0.05 << ":"
     << (_boundaryTop - _boundaryBottom) * 1.05 << "]" << endl;
  int idx = 1;
  of << "set object " << idx++ << " rect from "
     << _boundaryLeft << "," << _boundaryBottom << " to "
     << _boundaryRight << "," << _boundaryTop << "fc rgb \"grey\" behind\n";
  // point
  for (int i = 0; i < _init_p; ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"red\" front\n";
  }
  // RSG
  for (unsigned i = 0; i < _init_edges.size(); ++i) {
    Point& p1 = _points[_init_edges[i].p1];
    Point& p2 = _points[_init_edges[i].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"white\" lw 1 front\n";
  }
  // MST
  for (unsigned i = 0; i < _init_MST.size(); ++i) {
    Point& p1 = _points[_init_edges[_init_MST[i]].p1];
    Point& p2 = _points[_init_edges[_init_MST[i]].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"blue\" lw 1 front\n";
  }
  // s-point
  for (unsigned i = _init_p; i < _points.size(); ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"yellow\" front\n";
  }
  // RST
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "set arrow " << idx++ << " from "
        << p1.x << "," << p1.y << " to "
        << p2.x << "," << p1.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
    if (p1.y != p2.y) {
      of << "set arrow " << idx++ << " from "
        << p2.x << "," << p1.y << " to "
        << p2.x << "," << p2.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p1].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p2].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
  }
  of << "plot 1000000000" << endl;
  of << "pause -1 'Press any key'" << endl;
  of.close();
}